

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qhttpnetworkconnection_p.cpp
# Opt level: O2

void QHttpNetworkConnection::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      onlineStateChanged((QHttpNetworkConnection *)_o,*_a[1]);
      return;
    case 1:
      QHttpNetworkConnectionPrivate::_q_startNextRequest
                (*(QHttpNetworkConnectionPrivate **)(_o + 8));
      return;
    case 2:
      QHttpNetworkConnectionPrivate::_q_hostLookupFinished
                (*(QHttpNetworkConnectionPrivate **)(_o + 8),(QHostInfo *)_a[1]);
      return;
    case 3:
      QHttpNetworkConnectionPrivate::_q_connectDelayedChannel
                (*(QHttpNetworkConnectionPrivate **)(_o + 8));
      return;
    }
  }
  return;
}

Assistant:

void QHttpNetworkConnection::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QHttpNetworkConnection *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->onlineStateChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 1: _t->d_func()->_q_startNextRequest(); break;
        case 2: _t->d_func()->_q_hostLookupFinished((*reinterpret_cast< std::add_pointer_t<QHostInfo>>(_a[1]))); break;
        case 3: _t->d_func()->_q_connectDelayedChannel(); break;
        default: ;
        }
    }
}